

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyFileGuard.h
# Opt level: O0

void __thiscall jbcoin::KeyFileGuard::rmDir(KeyFileGuard *this,path *toRm)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  path *toRm_local;
  KeyFileGuard *this_local;
  
  bVar1 = boost::filesystem::is_directory(toRm);
  if (bVar1) {
    boost::filesystem::remove_all(toRm);
  }
  else {
    poVar2 = std::operator<<(&(this->test_->log).super_basic_ostream<char,_std::char_traits<char>_>,
                             "Expected ");
    psVar3 = boost::filesystem::path::string_abi_cxx11_(toRm);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    poVar2 = std::operator<<(poVar2," to be an existing directory.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

auto rmDir (path const& toRm)
    {
        if (is_directory (toRm))
            remove_all (toRm);
        else
            test_.log << "Expected " << toRm.string ()
                      << " to be an existing directory." << std::endl;
    }